

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  int iVar1;
  undefined1 local_a8 [4];
  int ret;
  secp256k1_gej pj;
  uchar *seckey_local;
  secp256k1_ge *p_local;
  secp256k1_scalar *seckey_scalar_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  pj._120_8_ = seckey;
  iVar1 = secp256k1_scalar_set_b32_seckey(seckey_scalar,seckey);
  secp256k1_scalar_cmov(seckey_scalar,&secp256k1_scalar_one,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  secp256k1_ecmult_gen(ecmult_gen_ctx,(secp256k1_gej *)local_a8,seckey_scalar);
  secp256k1_ge_set_gej(p,(secp256k1_gej *)local_a8);
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}